

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.h
# Opt level: O0

void __thiscall
YacclabTests::YacclabTests
          (YacclabTests *this,ModeConfig *mode_cfg,GlobalConfig *glob_cfg,error_code *ec)

{
  allocator local_49;
  string local_48 [32];
  error_code *local_28;
  error_code *ec_local;
  GlobalConfig *glob_cfg_local;
  ModeConfig *mode_cfg_local;
  YacclabTests *this_local;
  
  local_28 = ec;
  ec_local = (error_code *)glob_cfg;
  glob_cfg_local = (GlobalConfig *)mode_cfg;
  mode_cfg_local = (ModeConfig *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"",&local_49);
  OutputBox::OutputBox(&this->ob_,(string *)local_48,0x50,2);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  this->ec_ = local_28;
  this->mode_cfg_ = (ModeConfig *)glob_cfg_local;
  this->glob_cfg_ = (GlobalConfig *)ec_local;
  filesystem::operator/
            (&this->output_path,(path *)(ec_local + 0x1c),
             (path *)&(glob_cfg_local->input_path).field_0x10);
  cv::Mat_<double>::Mat_(&this->average_results_);
  cv::Mat_<double>::Mat_(&this->density_results_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>_>
  ::map(&this->granularity_results_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
  ::map(&this->average_ws_results_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
  ::map(&this->memory_accesses_);
  return;
}

Assistant:

YacclabTests(ModeConfig &mode_cfg, GlobalConfig &glob_cfg, std::error_code &ec) : 
		ec_(ec), mode_cfg_(mode_cfg), glob_cfg_(glob_cfg), output_path(glob_cfg.glob_output_path / mode_cfg.mode_output_path) {}